

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O0

_Bool gravity_hash_remove(gravity_hash_t *hashtable,gravity_value_t key)

{
  gravity_hash_iterate_fn p_Var1;
  _Bool _Var2;
  uint32_t uVar3;
  uint uVar4;
  hash_node_t *local_48;
  hash_node_t *prevnode;
  hash_node_t *node;
  gravity_hash_iterate_fn free_fn;
  uint32_t position;
  uint32_t hash;
  gravity_hash_t *hashtable_local;
  gravity_value_t key_local;
  
  uVar3 = (*hashtable->compute_fn)(key);
  uVar4 = uVar3 % hashtable->size;
  p_Var1 = hashtable->free_fn;
  prevnode = hashtable->nodes[uVar4];
  local_48 = (hash_node_t *)0x0;
  while( true ) {
    if (prevnode == (hash_node_t *)0x0) {
      return false;
    }
    if ((prevnode->hash == uVar3) && (_Var2 = (*hashtable->isequal_fn)(key,prevnode->key), _Var2))
    break;
    local_48 = prevnode;
    prevnode = prevnode->next;
  }
  if (p_Var1 != (gravity_hash_iterate_fn)0x0) {
    (*p_Var1)(hashtable,prevnode->key,prevnode->value,hashtable->data);
  }
  if (local_48 == (hash_node_t *)0x0) {
    hashtable->nodes[uVar4] = prevnode->next;
  }
  else {
    local_48->next = prevnode->next;
  }
  free(prevnode);
  hashtable->count = hashtable->count - 1;
  return true;
}

Assistant:

bool gravity_hash_remove (gravity_hash_t *hashtable, gravity_value_t key) {
    register uint32_t hash = hashtable->compute_fn(key);
    register uint32_t position = hash % hashtable->size;

    gravity_hash_iterate_fn free_fn = hashtable->free_fn;
    hash_node_t *node = hashtable->nodes[position];
    hash_node_t *prevnode = NULL;
    while (node) {
        if ((node->hash == hash) && (hashtable->isequal_fn(key, node->key))) {
            if (free_fn) free_fn(hashtable, node->key, node->value, hashtable->data);
            if (prevnode) prevnode->next = node->next;
            else hashtable->nodes[position] = node->next;
            mem_free(node);
            hashtable->count--;
            return true;
        }

        prevnode = node;
        node = node->next;
    }

    return false;
}